

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

void anon_unknown.dwarf_21fb62::CleanupFunction(string *namespaceName)

{
  bool bVar1;
  
  bVar1 = std::operator==(namespaceName,"image_function_avx");
  if (!bVar1) {
    bVar1 = std::operator==(namespaceName,"image_function_sse");
    if (!bVar1) {
      bVar1 = std::operator==(namespaceName,"image_function_neon");
      if (!bVar1) {
        return;
      }
    }
  }
  simd::EnableSimd(true);
  return;
}

Assistant:

void CleanupFunction(const std::string& namespaceName)
    {
        if ( (namespaceName == "image_function_avx") || (namespaceName == "image_function_sse") || (namespaceName == "image_function_neon") )
            simd::EnableSimd( true );
    }